

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O0

vector<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_> * __thiscall
dg::vr::RelationsAnalyzer::getEQICmp(RelationsAnalyzer *this,VRLocation *join)

{
  bool bVar1;
  Relation RVar2;
  reference ppVVar3;
  pointer this_00;
  reference ppIVar4;
  long in_RDX;
  vector<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_> *in_RSI;
  ICmpInst *in_RDI;
  Relation rel;
  ICmpInst *icmp;
  const_iterator __end3;
  const_iterator __begin3;
  vector<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_> *__range3;
  vector<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_> *icmps;
  VRAssumeBool *assume;
  VREdge *loopEnd;
  const_iterator __end2;
  const_iterator __begin2;
  vector<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_> *__range2;
  vector<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_> result;
  ICmpInst *in_stack_ffffffffffffff38;
  ICmpInst *icmp_00;
  __normal_iterator<const_llvm::ICmpInst_*const_*,_std::vector<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>_>
  local_90;
  undefined1 *local_88;
  int local_7c;
  undefined1 local_78 [24];
  undefined1 *local_60;
  VRAssumeBool *local_58;
  VREdge *local_50;
  VREdge **local_48;
  __normal_iterator<const_dg::vr::VREdge_*const_*,_std::vector<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>_>
  local_40;
  long local_38;
  long local_18;
  
  icmp_00 = in_RDI;
  local_18 = in_RDX;
  std::vector<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>::vector
            ((vector<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_> *)0x1d1166);
  local_38 = local_18 + 0x120;
  local_40._M_current =
       (VREdge **)
       std::vector<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>::begin
                 ((vector<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_> *)
                  in_stack_ffffffffffffff38);
  local_48 = (VREdge **)
             std::vector<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>::end
                       ((vector<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_> *)
                        in_stack_ffffffffffffff38);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_dg::vr::VREdge_*const_*,_std::vector<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>_>
                             *)in_RDI,
                            (__normal_iterator<const_dg::vr::VREdge_*const_*,_std::vector<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>_>
                             *)in_stack_ffffffffffffff38), bVar1) {
    ppVVar3 = __gnu_cxx::
              __normal_iterator<const_dg::vr::VREdge_*const_*,_std::vector<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>_>
              ::operator*(&local_40);
    local_50 = *ppVVar3;
    this_00 = std::unique_ptr<dg::vr::VROp,_std::default_delete<dg::vr::VROp>_>::operator->
                        ((unique_ptr<dg::vr::VROp,_std::default_delete<dg::vr::VROp>_> *)0x1d11e7);
    bVar1 = VROp::isAssumeBool(this_00);
    if (bVar1) {
      local_58 = (VRAssumeBool *)
                 std::unique_ptr<dg::vr::VROp,_std::default_delete<dg::vr::VROp>_>::get
                           ((unique_ptr<dg::vr::VROp,_std::default_delete<dg::vr::VROp>_> *)0x1d1206
                           );
      StructureAnalyzer::getRelevantConditions
                ((StructureAnalyzer *)__begin3._M_current,(VRAssumeBool *)__end3._M_current);
      local_60 = local_78;
      bVar1 = std::vector<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>::empty
                        (in_RSI);
      if (bVar1) {
        memset(in_RDI,0,0x18);
        std::vector<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>::vector
                  ((vector<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_> *)
                   0x1d125b);
        local_7c = 1;
      }
      else {
        local_88 = local_60;
        local_90._M_current =
             (ICmpInst **)
             std::vector<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>::begin
                       ((vector<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_> *)
                        in_stack_ffffffffffffff38);
        std::vector<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>::end
                  ((vector<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_> *)
                   in_stack_ffffffffffffff38);
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<const_llvm::ICmpInst_*const_*,_std::vector<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>_>
                                   *)in_RDI,
                                  (__normal_iterator<const_llvm::ICmpInst_*const_*,_std::vector<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>_>
                                   *)in_stack_ffffffffffffff38), bVar1) {
          ppIVar4 = __gnu_cxx::
                    __normal_iterator<const_llvm::ICmpInst_*const_*,_std::vector<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>_>
                    ::operator*(&local_90);
          in_stack_ffffffffffffff38 = *ppIVar4;
          VRAssumeBool::getAssumption(local_58);
          RVar2 = ICMPToRel(icmp_00,SUB81((ulong)in_RDI >> 0x38,0));
          if (RVar2 == EQ) {
            std::vector<llvm::ICmpInst_const*,std::allocator<llvm::ICmpInst_const*>>::
            emplace_back<llvm::ICmpInst_const*&>(in_RSI,(ICmpInst **)icmp_00);
          }
          __gnu_cxx::
          __normal_iterator<const_llvm::ICmpInst_*const_*,_std::vector<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>_>
          ::operator++(&local_90);
        }
        local_7c = 0;
      }
      std::vector<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>::~vector(in_RSI);
      if (local_7c != 0) goto LAB_001d134e;
    }
    __gnu_cxx::
    __normal_iterator<const_dg::vr::VREdge_*const_*,_std::vector<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>_>
    ::operator++(&local_40);
  }
  std::vector<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>::vector
            ((vector<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_> *)in_RDI,
             (vector<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_> *)
             in_stack_ffffffffffffff38);
  local_7c = 1;
LAB_001d134e:
  std::vector<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>::~vector(in_RSI);
  return (vector<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_> *)icmp_00;
}

Assistant:

std::vector<const llvm::ICmpInst *>
RelationsAnalyzer::getEQICmp(const VRLocation &join) {
    std::vector<const llvm::ICmpInst *> result;
    for (const auto *loopEnd : join.loopEnds) {
        if (!loopEnd->op->isAssumeBool())
            continue;

        const auto *assume = static_cast<VRAssumeBool *>(loopEnd->op.get());
        const auto &icmps = structure.getRelevantConditions(assume);
        if (icmps.empty())
            return {};

        for (const auto *icmp : icmps) {
            Relation rel = ICMPToRel(icmp, assume->getAssumption());

            if (rel != Relations::EQ)
                continue; // TODO check or collect

            result.emplace_back(icmp);
        }
    }
    return result;
}